

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O3

double JSON::ParseInt(wchar_t **data)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  double dVar3;
  
  pwVar1 = *data;
  wVar2 = *pwVar1;
  dVar3 = 0.0;
  if ((uint)(wVar2 + L'\xffffffd0') < 10) {
    do {
      dVar3 = dVar3 * 10.0 + (double)(wVar2 + L'\xffffffd0');
      wVar2 = pwVar1[1];
      pwVar1 = pwVar1 + 1;
    } while ((uint)(wVar2 + L'\xffffffd0') < 10);
    *data = pwVar1;
  }
  return dVar3;
}

Assistant:

double JSON::ParseInt(const wchar_t **data)
{
	double integer = 0;
	while (**data != 0 && **data >= '0' && **data <= '9')
		integer = integer * 10 + (*(*data)++ - '0');
	
	return integer;
}